

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftzopen.c
# Opt level: O3

int ft_lzwstate_stack_grow(FT_LzwState state)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 in_RAX;
  FT_Byte *pFVar8;
  ulong cur_count;
  FT_Offset new_count;
  FT_Error error;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  cur_count = state->stack_size;
  if (state->stack_top < cur_count) {
    return 0;
  }
  new_count = (cur_count >> 1) + cur_count + 4;
  pFVar8 = state->stack;
  if (pFVar8 == state->stack_0) {
    state->stack = (FT_Byte *)0x0;
    if (0xffff < new_count) {
      new_count = 0x10000;
    }
    pFVar8 = (FT_Byte *)0x0;
    cur_count = 0;
  }
  else if ((0xfffc < (cur_count >> 1) + cur_count) && (new_count = 0x10000, cur_count == 0x10000)) {
    return -1;
  }
  pFVar8 = (FT_Byte *)ft_mem_qrealloc(state->memory,1,cur_count,new_count,pFVar8,&local_34);
  state->stack = pFVar8;
  if (local_34 != 0) {
    return -1;
  }
  if (cur_count == 0) {
    uVar1 = *(undefined8 *)state->stack_0;
    uVar2 = *(undefined8 *)(state->stack_0 + 8);
    uVar3 = *(undefined8 *)(state->stack_0 + 0x10);
    uVar4 = *(undefined8 *)(state->stack_0 + 0x18);
    uVar5 = *(undefined8 *)(state->stack_0 + 0x20);
    uVar6 = *(undefined8 *)(state->stack_0 + 0x28);
    uVar7 = *(undefined8 *)(state->stack_0 + 0x38);
    *(undefined8 *)(pFVar8 + 0x30) = *(undefined8 *)(state->stack_0 + 0x30);
    *(undefined8 *)(pFVar8 + 0x38) = uVar7;
    *(undefined8 *)(pFVar8 + 0x20) = uVar5;
    *(undefined8 *)(pFVar8 + 0x28) = uVar6;
    *(undefined8 *)(pFVar8 + 0x10) = uVar3;
    *(undefined8 *)(pFVar8 + 0x18) = uVar4;
    *(undefined8 *)pFVar8 = uVar1;
    *(undefined8 *)(pFVar8 + 8) = uVar2;
  }
  state->stack_size = new_count;
  return 0;
}

Assistant:

static int
  ft_lzwstate_stack_grow( FT_LzwState  state )
  {
    if ( state->stack_top >= state->stack_size )
    {
      FT_Memory  memory = state->memory;
      FT_Error   error;
      FT_Offset  old_size = state->stack_size;
      FT_Offset  new_size = old_size;

      new_size = new_size + ( new_size >> 1 ) + 4;

      /* if relocating to heap */
      if ( state->stack == state->stack_0 )
      {
        state->stack = NULL;
        old_size     = 0;
      }

      /* requirement of the character stack larger than 1<<LZW_MAX_BITS */
      /* implies bug in the decompression code                          */
      if ( new_size > ( 1 << LZW_MAX_BITS ) )
      {
        new_size = 1 << LZW_MAX_BITS;
        if ( new_size == old_size )
          return -1;
      }

      if ( FT_QREALLOC( state->stack, old_size, new_size ) )
        return -1;

      /* if relocating to heap */
      if ( old_size == 0 )
        FT_MEM_COPY( state->stack, state->stack_0, FT_LZW_DEFAULT_STACK_SIZE );

      state->stack_size = new_size;
    }
    return 0;
  }